

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

int CentralBroker::logging_shutdown_pipe(zloop_t *loop,zsock_t *reader,void *arg)

{
  int iVar1;
  char *__s1;
  
  __s1 = zstr_recv(reader);
  iVar1 = strcmp(__s1,"$TERM");
  free(__s1);
  return -(uint)(iVar1 == 0);
}

Assistant:

int CentralBroker::logging_shutdown_pipe(zloop_t *loop, zsock_t *reader, void *arg){
//    CentralBroker *self = (CentralBroker*)arg;
    char *msg = zstr_recv(reader);
    int rc = 0;
    if(streq(msg, "$TERM")){
        rc = -1;
    }
    freen(msg);
    return rc;
}